

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O0

int numusehash(Table *t,uint *nums,uint *pna)

{
  int iVar1;
  Node *n;
  int local_28;
  int i;
  int ause;
  int totaluse;
  uint *pna_local;
  uint *nums_local;
  Table *t_local;
  
  i = 0;
  local_28 = 0;
  n._4_4_ = 1 << (t->lsizenode & 0x1f);
  while (iVar1 = n._4_4_ + -1, n._4_4_ != 0) {
    n._4_4_ = iVar1;
    if (t->node[iVar1].i_val.tt_ != 0) {
      iVar1 = countint(&t->node[iVar1].i_key.tvk,nums);
      local_28 = iVar1 + local_28;
      i = i + 1;
    }
  }
  *pna = local_28 + *pna;
  return i;
}

Assistant:

static int numusehash (const Table *t, unsigned int *nums, unsigned int *pna) {
  int totaluse = 0;  /* total number of elements */
  int ause = 0;  /* elements added to 'nums' (can go to array part) */
  int i = sizenode(t);
  while (i--) {
    Node *n = &t->node[i];
    if (!isempty(gval(n))) {
      if (keyisinteger(n))
        ause += countint(keyival(n), nums);
      totaluse++;
    }
  }
  *pna += ause;
  return totaluse;
}